

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_disable_deviations(lys_module *module)

{
  byte bVar1;
  ushort uVar2;
  lys_deviation *plVar3;
  char *__needle;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  unres_schema *puVar7;
  unres_schema *puVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  unres_schema *local_50;
  unres_schema *unres;
  unres_schema *local_40;
  lys_module *local_38;
  
  uVar2 = *(ushort *)&module->field_0x40;
  if ((uVar2 & 0x30) != 0) {
    local_50 = (unres_schema *)calloc(1,0x28);
    if (local_50 == (unres_schema *)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_disable_deviations");
      return;
    }
    puVar8 = (unres_schema *)(ulong)(uint)(module->ctx->models).used;
    puVar7 = local_50;
    if (puVar8 != (unres_schema *)0x0) {
      do {
        local_40 = puVar7;
        local_38 = (module->ctx->models).list[(long)&puVar8[-1].field_0x27];
        unres = puVar8;
        if ((local_38 != module) && ((ulong)local_38->deviation_size != 0)) {
          lVar11 = (ulong)local_38->deviation_size * 0x38 + -0x38;
          do {
            plVar3 = local_38->deviation;
            __needle = module->name;
            pcVar5 = strstr(*(char **)((long)&plVar3->target_name + lVar11),__needle);
            if ((pcVar5 != (char *)0x0) && (sVar6 = strlen(__needle), pcVar5[sVar6] == ':')) {
              lys_switch_deviation
                        ((lys_deviation *)((long)&plVar3->target_name + lVar11),local_38,local_40);
            }
            lVar11 = lVar11 + -0x38;
          } while (lVar11 != -0x38);
        }
        puVar8 = (unres_schema *)&unres[-1].field_0x27;
        puVar7 = local_40;
      } while (puVar8 != (unres_schema *)0x0);
      uVar2 = *(ushort *)&module->field_0x40;
    }
    if ((uVar2 & 0x30) != 0x10) {
      __assert_fail("module->deviated == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x1232,"void lys_disable_deviations(struct lys_module *)");
    }
    *(ushort *)&module->field_0x40 = uVar2 & 0xffcf | 0x20;
    bVar10 = module->inc_size;
    if (bVar10 != 0) {
      lVar11 = 0;
      uVar9 = 0;
      do {
        lVar4 = *(long *)(module->inc->rev + lVar11 + -8);
        bVar1 = *(byte *)(lVar4 + 0x40);
        if ((bVar1 & 0x30) != 0) {
          *(byte *)(lVar4 + 0x40) = bVar1 & 0xcf | module->field_0x40 & 0x30;
          bVar10 = module->inc_size;
        }
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x30;
      } while (uVar9 < bVar10);
    }
    if (puVar7->count != 0) {
      resolve_unres_schema(module,puVar7);
    }
    unres_schema_free(module,&local_50,1);
  }
  return;
}

Assistant:

void
lys_disable_deviations(struct lys_module *module)
{
    uint32_t i, j;
    const struct lys_module *mod;
    const char *ptr;
    struct unres_schema *unres;

    if (module->deviated) {
        unres = calloc(1, sizeof *unres);
        LY_CHECK_ERR_RETURN(!unres, LOGMEM(module->ctx), );

        i = module->ctx->models.used;
        while (i--) {
            mod = module->ctx->models.list[i];

            if (mod == module) {
                continue;
            }

            j = mod->deviation_size;
            while (j--) {
                ptr = strstr(mod->deviation[j].target_name, module->name);
                if (ptr && ptr[strlen(module->name)] == ':') {
                    lys_switch_deviation(&mod->deviation[j], mod, unres);
                }
            }
        }

        assert(module->deviated == 1);
        module->deviated = 2;

        for (j = 0; j < module->inc_size; j++) {
            if (module->inc[j].submodule->deviated) {
                module->inc[j].submodule->deviated = module->deviated;
            }
        }

        if (unres->count) {
            resolve_unres_schema(module, unres);
        }
        unres_schema_free(module, &unres, 1);
    }
}